

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void CEngine::Con_DbgLognetwork(IResult *pResult,void *pUserData)

{
  long lVar1;
  IOHANDLE DataLogSent;
  IOHANDLE DataLogRecv;
  long in_FS_OFFSET;
  char aFilenameRecv [128];
  char aFilenameSent [128];
  char aBuf [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)((long)pUserData + 0x150) == '\x01') {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      StopLogging((CEngine *)pUserData);
      return;
    }
  }
  else {
    str_timestamp(aBuf,0x20);
    str_format(aFilenameSent,0x80,"dumps/%s_network_sent_%s.txt",
               *(undefined8 *)((long)pUserData + 0x168),aBuf);
    str_format(aFilenameRecv,0x80,"dumps/%s_network_recv_%s.txt",
               *(undefined8 *)((long)pUserData + 0x168),aBuf);
    DataLogSent = (IOHANDLE)
                  (**(code **)(**(long **)((long)pUserData + 0x148) + 0x20))
                            (*(long **)((long)pUserData + 0x148),aFilenameSent,2,0,0,0,0,0);
    DataLogRecv = (IOHANDLE)
                  (**(code **)(**(long **)((long)pUserData + 0x148) + 0x20))
                            (*(long **)((long)pUserData + 0x148),aFilenameRecv,2,0,0,0,0,0);
    StartLogging((CEngine *)pUserData,DataLogSent,DataLogRecv);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void Con_DbgLognetwork(IConsole::IResult *pResult, void *pUserData)
	{
		CEngine *pEngine = static_cast<CEngine *>(pUserData);

		if(pEngine->m_Logging)
		{
			pEngine->StopLogging();
		}
		else
		{
			char aBuf[32];
			str_timestamp(aBuf, sizeof(aBuf));
			char aFilenameSent[128], aFilenameRecv[128];
			str_format(aFilenameSent, sizeof(aFilenameSent), "dumps/%s_network_sent_%s.txt", pEngine->m_pAppname, aBuf);
			str_format(aFilenameRecv, sizeof(aFilenameRecv), "dumps/%s_network_recv_%s.txt", pEngine->m_pAppname, aBuf);
			pEngine->StartLogging(pEngine->m_pStorage->OpenFile(aFilenameSent, IOFLAG_WRITE, IStorage::TYPE_SAVE),
									pEngine->m_pStorage->OpenFile(aFilenameRecv, IOFLAG_WRITE, IStorage::TYPE_SAVE));
		}
	}